

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asset-resolution.cc
# Opt level: O0

string * __thiscall
tinyusdz::AssetResolutionResolver::search_paths_str_abi_cxx11_
          (string *__return_storage_ptr__,AssetResolutionResolver *this)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_28;
  size_t i;
  AssetResolutionResolver *this_local;
  string *str;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"[ ");
  for (local_28 = 0;
      sVar1 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->_search_paths), local_28 < sVar1; local_28 = local_28 + 1) {
    if (local_28 != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
    }
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&this->_search_paths,local_28);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar2);
  }
  ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ]");
  return __return_storage_ptr__;
}

Assistant:

std::string AssetResolutionResolver::search_paths_str() const {
  std::string str;

  str += "[ ";
  for (size_t i = 0; i < _search_paths.size(); i++) {
    if (i > 0) {
      str += ", ";
    }
    // TODO: Escape character?
    str += _search_paths[i];
  }
  str += " ]";
  return str;
}